

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
          (sysbvm_context_t *context,char *symbolString,size_t argumentCount,sysbvm_bitflags_t flags
          ,void *userdata,sysbvm_functionEntryPoint_t entryPoint)

{
  anon_struct_16_2_a3b20552 gcFrame;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  sysbvm_tuple_t *local_40;
  
  local_40 = &local_68;
  local_68 = 0;
  sStack_60 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 2;
  sysbvm_stackFrame_pushRecord(&local_58);
  local_68 = sysbvm_symbol_internWithCString(context,symbolString);
  sStack_60 = sysbvm_function_createPrimitive(context,argumentCount,flags,userdata,entryPoint);
  sysbvm_namespace_setNewSymbolBindingWithValue
            (context,(context->roots).globalNamespace,local_68,sStack_60);
  sysbvm_stackFrame_popRecord(&local_58);
  return sStack_60;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(sysbvm_context_t *context, const char *symbolString, size_t argumentCount, sysbvm_bitflags_t flags, void *userdata, sysbvm_functionEntryPoint_t entryPoint)
{
    struct {
        sysbvm_tuple_t symbol;
        sysbvm_tuple_t primitiveFunction;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.symbol = sysbvm_symbol_internWithCString(context, symbolString);
    gcFrame.primitiveFunction = sysbvm_function_createPrimitive(context, argumentCount, flags, userdata, entryPoint);
    sysbvm_context_setIntrinsicSymbolBindingValue(context, gcFrame.symbol, gcFrame.primitiveFunction);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.primitiveFunction;
}